

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fits_relurl2url(char *refURL,char *relURL,char *absURL,int *status)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  int *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *tmpStr2;
  char *tmpStr1;
  char tmpStr [1025];
  int i;
  size_t in_stack_fffffffffffffba8;
  char *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  char *local_440;
  char local_438 [16];
  int *in_stack_fffffffffffffbd8;
  char *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  int local_2c;
  
  if (*in_RCX != 0) {
    return *in_RCX;
  }
  sVar2 = strlen(in_RDI);
  if (sVar2 < 0x401) {
    strcpy(local_438,in_RDI);
    iVar1 = fits_strncasecmp(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                             in_stack_fffffffffffffba8);
    if ((iVar1 == 0) ||
       (iVar1 = fits_strncasecmp(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                                 in_stack_fffffffffffffba8), iVar1 == 0)) {
      ffpmsg((char *)0x1cdd3f);
      ffpmsg((char *)0x1cdd4b);
      ffpmsg((char *)0x1cdd57);
      *in_RCX = 0x7d;
    }
    else {
      if (*in_RSI == '/') {
        strcpy(in_RDX,"/");
        for (local_2c = 0; in_RSI[local_2c] == '/'; local_2c = local_2c + 1) {
          sVar2 = strlen(in_RDX);
          if (0x400 < sVar2 + 1) {
            *in_RDX = '\0';
            ffpmsg((char *)0x1cde82);
            *in_RCX = 0x7d;
            return *in_RCX;
          }
          strcat(in_RDX,"/");
        }
        local_440 = local_438;
        sVar2 = strlen(in_RDX);
        while (pcVar3 = strstr(local_440,in_RDX), pcVar3 != (char *)0x0) {
          local_440 = pcVar3 + (int)sVar2;
        }
        in_RDX[(int)sVar2 + -1] = '\0';
        pcVar3 = strstr(local_440,in_RDX);
        if (pcVar3 == (char *)0x0) {
          pcVar3 = strrchr(local_440,0x2f);
          if (pcVar3 == (char *)0x0) {
            local_438[0] = '\0';
          }
          else {
            *pcVar3 = '\0';
          }
        }
        else {
          *pcVar3 = '\0';
        }
        sVar2 = strlen(local_438);
        sVar4 = strlen(in_RSI);
        if (0x400 < sVar2 + sVar4) {
          *in_RDX = '\0';
          ffpmsg((char *)0x1cdfd5);
          *in_RCX = 0x7d;
          goto LAB_001ce01d;
        }
        strcat(local_438,in_RSI);
      }
      else {
        pcVar3 = strrchr(local_438,0x2f);
        if (pcVar3 == (char *)0x0) {
          local_438[0] = '\0';
        }
        else {
          pcVar3[1] = '\0';
        }
        sVar2 = strlen(local_438);
        sVar4 = strlen(in_RSI);
        if (0x400 < sVar2 + sVar4) {
          *in_RDX = '\0';
          ffpmsg((char *)0x1cddf0);
          *in_RCX = 0x7d;
          goto LAB_001ce01d;
        }
        strcat(local_438,in_RSI);
      }
      iVar1 = fits_clean_url(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                             in_stack_fffffffffffffbd8);
      *in_RCX = iVar1;
    }
  }
  else {
    *in_RDX = '\0';
    ffpmsg((char *)0x1cdcd8);
    *in_RCX = 0x7d;
  }
LAB_001ce01d:
  return *in_RCX;
}

Assistant:

int fits_relurl2url(char     *refURL, /* I reference URL string             */
		    char     *relURL, /* I relative URL string to process   */
		    char     *absURL, /* O absolute URL string              */
		    int      *status)
/*
  create an absolute URL from a relative url and a reference URL. The 
  reference URL is given by the FITS file pointed to by fptr.

  The construction of the absolute URL from the partial and reference URl
  is performed using the rules set forth in:
 
  http://www.w3.org/Addressing/URL/URL_TOC.html
  and
  http://www.w3.org/Addressing/URL/4_3_Partial.html

  Note that the relative URL string relURL must conform to the Unix-like
  URL syntax; host dependent partial URL strings are not allowed.
*/
{
  int i;

  char tmpStr[FLEN_FILENAME];

  char *tmpStr1, *tmpStr2;


  if(*status != 0) return(*status);
  
  do
    {

      /*
	make a copy of the reference URL string refURL for parsing purposes
      */

      if (strlen(refURL) > FLEN_FILENAME-1)
      {
         absURL[0]=0;
         ffpmsg("ref URL is too long (fits_relurl2url)");
         *status = URL_PARSE_ERROR;
         continue;
      }
      strcpy(tmpStr,refURL);

      /*
	if the reference file has an access method of mem:// or shmem://
	then we cannot use it as the basis of an absolute URL construction
	for a partial URL
      */
	  
      if(fits_strncasecmp(tmpStr,"MEM:",4)   == 0 ||
                	                fits_strncasecmp(tmpStr,"SHMEM:",6) == 0)
	{
	  ffpmsg("ref URL has access mem:// or shmem:// (fits_relurl2url)");
	  ffpmsg("   cannot construct full URL from a partial URL and ");
	  ffpmsg("   MEM/SHMEM base URL");
	  *status = URL_PARSE_ERROR;
	  continue;
	}

      if(relURL[0] != '/')
	{
	  /*
	    just append the relative URL string to the reference URL
	    string (minus the reference URL file name) to form the 
	    absolute URL string
	  */
	      
	  tmpStr1 = strrchr(tmpStr,'/');
	  
	  if(tmpStr1 != NULL) tmpStr1[1] = 0;
	  else                tmpStr[0]  = 0;
	  
          if (strlen(tmpStr)+strlen(relURL) > FLEN_FILENAME-1)
          {
              absURL[0]=0;
              ffpmsg("rel + ref URL is too long (fits_relurl2url)");
              *status = URL_PARSE_ERROR;
              continue;
          }
	  strcat(tmpStr,relURL);
	}
      else
	{
	  /*
	    have to parse the refURL string for the first occurnace of the 
	    same number of '/' characters as contained in the beginning of
	    location that is not followed by a greater number of consective 
	    '/' charaters (yes, that is a confusing statement); this is the 
	    location in the refURL string where the relURL string is to
	    be appended to form the new absolute URL string
	   */
	  
	  /*
	    first, build up a slash pattern string that has one more
	    slash in it than the starting slash pattern of the
	    relURL string
	  */
	  
	  strcpy(absURL,"/");
	  
	  for(i = 0; relURL[i] == '/'; ++i) 
          {
             if (strlen(absURL) + 1 > FLEN_FILENAME-1)
             {
                 absURL[0]=0;
                 ffpmsg("abs URL is too long (fits_relurl2url)");
                 *status = URL_PARSE_ERROR;
                 return (*status);
             }
             strcat(absURL,"/");
          }
	  
	  /*
	    loop over the refURL string until the slash pattern stored
	    in absURL is no longer found
	  */

	  for(tmpStr1 = tmpStr, i = strlen(absURL); 
	      (tmpStr2 = strstr(tmpStr1,absURL)) != NULL;
	      tmpStr1 = tmpStr2 + i);
	  
	  /* reduce the slash pattern string by one slash */
	  
	  absURL[i-1] = 0;
	  
	  /* 
	     search for the slash pattern in the remaining portion
	     of the refURL string
	  */

	  tmpStr2 = strstr(tmpStr1,absURL);
	  
	  /* if no slash pattern match was found */
	  
	  if(tmpStr2 == NULL)
	    {
	      /* just strip off the file name from the refURL  */
	      
	      tmpStr2 = strrchr(tmpStr1,'/');
	      
	      if(tmpStr2 != NULL) tmpStr2[0] = 0;
	      else                tmpStr[0]  = 0;
	    }
	  else
	    {
	      /* set a string terminator at the slash pattern match */
	      
	      *tmpStr2 = 0;
	    }
	  
	  /* 
	    conatenate the relURL string to the refURL string to form
	    the absURL
	   */

          if (strlen(tmpStr)+strlen(relURL) > FLEN_FILENAME-1)
          {
              absURL[0]=0;
              ffpmsg("rel + ref URL is too long (fits_relurl2url)");
              *status = URL_PARSE_ERROR;
              continue;
          }
	  strcat(tmpStr,relURL);
	}

      /*
	normalize the absURL by removing any ".." or "." specifiers
	in the string
      */

      *status = fits_clean_url(tmpStr,absURL,status);

    }while(0);

  return(*status);
}